

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigIsoSlow.c
# Opt level: O2

void Iso_ManAssignAdjacency(Iso_Man_t *p)

{
  Vec_Ptr_t *p_00;
  ulong uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  void *pvVar6;
  long lVar7;
  Aig_Obj_t *pAVar8;
  Aig_Obj_t *pAVar9;
  Iso_Obj_t *pIVar10;
  Iso_Obj_t *pIVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  
  lVar13 = 4;
  lVar14 = 0;
  while( true ) {
    p_00 = p->pAig->vObjs;
    uVar2 = p_00->nSize;
    if ((int)uVar2 <= lVar14) break;
    pvVar6 = Vec_PtrEntry(p_00,(int)lVar14);
    if (pvVar6 != (void *)0x0) {
      pIVar10 = p->pObjs;
      *(undefined8 *)(&pIVar10->field_0x0 + lVar13) = 0;
      uVar2 = (uint)*(undefined8 *)((long)pvVar6 + 0x18);
      if (((uVar2 & 7) != 3) && (0xfffffffd < (uVar2 & 7) - 7)) {
        uVar1 = *(ulong *)((long)pvVar6 + 8);
        lVar7 = -1;
        if (uVar1 != 0) {
          lVar7 = (long)*(int *)((uVar1 & 0xfffffffffffffffe) + 0x24);
        }
        uVar2 = pIVar10[lVar7].FaninSig;
        *(uint *)(&pIVar10->field_0x0 + lVar13) = uVar2;
        iVar3 = pIVar10[lVar7].Id;
        pIVar11 = pIVar10;
        if (iVar3 != 0) {
          uVar2 = Abc_Var2Lit(iVar3,(uint)uVar1 & 1);
          uVar2 = iVar3 * s_1kPrimes[uVar2 & 0x3ff] + *(int *)(&pIVar10->field_0x0 + lVar13);
          *(uint *)(&pIVar10->field_0x0 + lVar13) = uVar2;
          pIVar11 = p->pObjs;
        }
        uVar1 = *(ulong *)((long)pvVar6 + 0x10);
        lVar7 = -1;
        if (uVar1 != 0) {
          lVar7 = (long)*(int *)((uVar1 & 0xfffffffffffffffe) + 0x24);
        }
        *(uint *)(&pIVar10->field_0x0 + lVar13) = uVar2 + pIVar11[lVar7].FaninSig;
        iVar3 = pIVar11[lVar7].Id;
        if (iVar3 != 0) {
          uVar2 = Abc_Var2Lit(iVar3,(uint)uVar1 & 1);
          *(int *)(&pIVar10->field_0x0 + lVar13) =
               *(int *)(&pIVar10->field_0x0 + lVar13) + iVar3 * s_1kPrimes[uVar2 & 0x3ff];
        }
      }
    }
    lVar14 = lVar14 + 1;
    lVar13 = lVar13 + 0x18;
  }
LAB_0051cb44:
  do {
    lVar13 = -1;
    if ((int)uVar2 < 1) {
      iVar3 = 0;
      do {
        if (p->pAig->nRegs <= iVar3) {
          return;
        }
        pAVar8 = Aig_ManLi(p->pAig,iVar3);
        pAVar9 = Aig_ManLo(p->pAig,iVar3);
        if ((pAVar8->pFanin0 == (Aig_Obj_t *)0x0) ||
           (*(int *)(((ulong)pAVar8->pFanin0 & 0xfffffffffffffffe) + 0x24) != 0)) {
          pIVar10 = Iso_ManObj(p,pAVar9->Id);
          iVar12 = -1;
          if (pAVar8->pFanin0 != (Aig_Obj_t *)0x0) {
            iVar12 = *(int *)(((ulong)pAVar8->pFanin0 & 0xfffffffffffffffe) + 0x24);
          }
          pIVar11 = Iso_ManObj(p,iVar12);
          if (pIVar10->FaninSig != 0) {
            __assert_fail("pIso->FaninSig == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigIsoSlow.c"
                          ,0x34d,"void Iso_ManAssignAdjacency(Iso_Man_t *)");
          }
          pIVar10->FaninSig = pIVar11->FaninSig;
          iVar12 = pIVar11->Id;
          if (iVar12 != 0) {
            uVar2 = Abc_Var2Lit(iVar12,*(uint *)&pAVar8->pFanin0 & 1);
            pIVar10->FaninSig = pIVar10->FaninSig + iVar12 * s_1kPrimes[uVar2 & 0x3ff];
          }
          pIVar11->FanoutSig = pIVar11->FanoutSig + pIVar10->FanoutSig;
          iVar12 = pIVar10->Id;
          if (iVar12 != 0) {
            uVar2 = Abc_Var2Lit(iVar12,*(uint *)&pAVar8->pFanin0 & 1);
            pIVar11->FanoutSig = pIVar11->FanoutSig + iVar12 * s_1kPrimes[uVar2 & 0x3ff];
          }
        }
        iVar3 = iVar3 + 1;
      } while( true );
    }
    uVar5 = uVar2 - 1;
    pAVar8 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vObjs,uVar2 - 1);
    uVar2 = uVar5;
  } while (((pAVar8 == (Aig_Obj_t *)0x0) || ((*(uint *)&pAVar8->field_0x18 & 7) == 2)) ||
          (iVar3 = Aig_ObjIsConst1(pAVar8), iVar3 != 0));
  pIVar10 = p->pObjs;
  uVar4 = (uint)*(undefined8 *)&pAVar8->field_0x18;
  pIVar11 = pIVar10;
  if ((uVar4 & 7) != 3) goto LAB_0051cbad;
  if (pIVar10[uVar5].Id != 0) {
    __assert_fail("!Aig_ObjIsCo(pObj) || pIso->Id == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigIsoSlow.c"
                  ,0x317,"void Iso_ManAssignAdjacency(Iso_Man_t *)");
  }
  pAVar8 = pAVar8->pFanin0;
  goto LAB_0051cc14;
LAB_0051cbad:
  if (0xfffffffd < (uVar4 & 7) - 7) {
    pAVar9 = pAVar8->pFanin0;
    if (pAVar9 != (Aig_Obj_t *)0x0) {
      lVar13 = (long)*(int *)(((ulong)pAVar9 & 0xfffffffffffffffe) + 0x24);
    }
    pIVar10[lVar13].FanoutSig = pIVar10[lVar13].FanoutSig + pIVar10[uVar5].FanoutSig;
    iVar3 = pIVar10[uVar5].Id;
    if (iVar3 != 0) {
      uVar4 = Abc_Var2Lit(iVar3,(uint)pAVar9 & 1);
      pIVar10[lVar13].FanoutSig = pIVar10[lVar13].FanoutSig + iVar3 * s_1kPrimes[uVar4 & 0x3ff];
      pIVar11 = p->pObjs;
    }
    pAVar8 = pAVar8->pFanin1;
LAB_0051cc14:
    lVar13 = -1;
    if (pAVar8 != (Aig_Obj_t *)0x0) {
      lVar13 = (long)*(int *)(((ulong)pAVar8 & 0xfffffffffffffffe) + 0x24);
    }
    pIVar11[lVar13].FanoutSig = pIVar11[lVar13].FanoutSig + pIVar10[uVar5].FanoutSig;
    iVar3 = pIVar10[uVar5].Id;
    if (iVar3 != 0) {
      uVar5 = Abc_Var2Lit(iVar3,(uint)pAVar8 & 1);
      pIVar11[lVar13].FanoutSig = pIVar11[lVar13].FanoutSig + iVar3 * s_1kPrimes[uVar5 & 0x3ff];
    }
  }
  goto LAB_0051cb44;
}

Assistant:

void Iso_ManAssignAdjacency( Iso_Man_t * p )
{
    int fUseXor = 0;
    Iso_Obj_t * pIso, * pIsoF;
    Aig_Obj_t * pObj, * pObjLi;
    int i;

    // create TFI signatures
    Aig_ManForEachObj( p->pAig, pObj, i )
    {
        pIso = p->pObjs + i;
        pIso->FaninSig = 0;
        pIso->FanoutSig = 0;

        if ( Aig_ObjIsCo(pObj) )
            continue;
        if ( fUseXor )
        {
            if ( Aig_ObjIsNode(pObj) )
            {
                pIsoF = p->pObjs + Aig_ObjFaninId0(pObj);
                pIso->FaninSig ^= pIsoF->FaninSig;
                if ( pIsoF->Id )
                    pIso->FaninSig ^= s_1kPrimes[Abc_Var2Lit(pIsoF->Id, Aig_ObjFaninC0(pObj)) & ISO_MASK];

                pIsoF = p->pObjs + Aig_ObjFaninId1(pObj);
                pIso->FaninSig ^= pIsoF->FaninSig;
                if ( pIsoF->Id )
                    pIso->FaninSig ^= s_1kPrimes[Abc_Var2Lit(pIsoF->Id, Aig_ObjFaninC1(pObj)) & ISO_MASK];
            }
        }
        else
        {
            if ( Aig_ObjIsNode(pObj) )
            {
                pIsoF = p->pObjs + Aig_ObjFaninId0(pObj);
                pIso->FaninSig += pIsoF->FaninSig;
                if ( pIsoF->Id )
                    pIso->FaninSig += pIsoF->Id * s_1kPrimes[Abc_Var2Lit(pIsoF->Id, Aig_ObjFaninC0(pObj)) & ISO_MASK];

                pIsoF = p->pObjs + Aig_ObjFaninId1(pObj);
                pIso->FaninSig += pIsoF->FaninSig;
                if ( pIsoF->Id )
                    pIso->FaninSig += pIsoF->Id * s_1kPrimes[Abc_Var2Lit(pIsoF->Id, Aig_ObjFaninC1(pObj)) & ISO_MASK];
            }
        }
    }
    // create TFO signatures
    Aig_ManForEachObjReverse( p->pAig, pObj, i )
    {
        if ( Aig_ObjIsCi(pObj) || Aig_ObjIsConst1(pObj) )
            continue;
        pIso = p->pObjs + i;
        assert( !Aig_ObjIsCo(pObj) || pIso->Id == 0 );
        if ( fUseXor )
        {
            if ( Aig_ObjIsNode(pObj) )
            {
                pIsoF = p->pObjs + Aig_ObjFaninId0(pObj);
                pIsoF->FanoutSig ^= pIso->FanoutSig;
                if ( pIso->Id )
                    pIsoF->FanoutSig ^= s_1kPrimes[Abc_Var2Lit(pIso->Id, Aig_ObjFaninC0(pObj)) & ISO_MASK];

                pIsoF = p->pObjs + Aig_ObjFaninId1(pObj);
                pIsoF->FanoutSig ^= pIso->FanoutSig;
                if ( pIso->Id )
                    pIsoF->FanoutSig ^= s_1kPrimes[Abc_Var2Lit(pIso->Id, Aig_ObjFaninC1(pObj)) & ISO_MASK];
            }
            else if ( Aig_ObjIsCo(pObj) )
            {
                pIsoF = p->pObjs + Aig_ObjFaninId0(pObj);
                pIsoF->FanoutSig ^= pIso->FanoutSig;
                if ( pIso->Id )
                    pIsoF->FanoutSig ^= s_1kPrimes[Abc_Var2Lit(pIso->Id, Aig_ObjFaninC0(pObj)) & ISO_MASK];
            }
        }
        else
        {
            if ( Aig_ObjIsNode(pObj) )
            {
                pIsoF = p->pObjs + Aig_ObjFaninId0(pObj);
                pIsoF->FanoutSig += pIso->FanoutSig;
                if ( pIso->Id )
                    pIsoF->FanoutSig += pIso->Id * s_1kPrimes[Abc_Var2Lit(pIso->Id, Aig_ObjFaninC0(pObj)) & ISO_MASK];

                pIsoF = p->pObjs + Aig_ObjFaninId1(pObj);
                pIsoF->FanoutSig += pIso->FanoutSig;
                if ( pIso->Id )
                    pIsoF->FanoutSig += pIso->Id * s_1kPrimes[Abc_Var2Lit(pIso->Id, Aig_ObjFaninC1(pObj)) & ISO_MASK];
            }
            else if ( Aig_ObjIsCo(pObj) )
            {
                pIsoF = p->pObjs + Aig_ObjFaninId0(pObj);
                pIsoF->FanoutSig += pIso->FanoutSig;
                if ( pIso->Id )
                    pIsoF->FanoutSig += pIso->Id * s_1kPrimes[Abc_Var2Lit(pIso->Id, Aig_ObjFaninC0(pObj)) & ISO_MASK];
            }
        }
    }

    // consider flops
    Aig_ManForEachLiLoSeq( p->pAig, pObjLi, pObj, i )
    {
        if ( Aig_ObjFaninId0(pObjLi) == 0 ) // ignore constant!
            continue;
        pIso  = Iso_ManObj( p, Aig_ObjId(pObj) );
        pIsoF = Iso_ManObj( p, Aig_ObjFaninId0(pObjLi) );
        assert( pIso->FaninSig == 0 );
//        assert( pIsoF->FanoutSig == 0 );

        if ( fUseXor )
        {
            pIso->FaninSig = pIsoF->FaninSig;
            if ( pIsoF->Id )
                pIso->FaninSig ^= s_1kPrimes[Abc_Var2Lit(pIsoF->Id, Aig_ObjFaninC0(pObjLi)) & ISO_MASK];

            pIsoF->FanoutSig += pIso->FanoutSig;
            if ( pIso->Id )
                pIsoF->FanoutSig ^= s_1kPrimes[Abc_Var2Lit(pIso->Id, Aig_ObjFaninC0(pObjLi)) & ISO_MASK];
        }
        else
        {
            pIso->FaninSig = pIsoF->FaninSig;
            if ( pIsoF->Id )
                pIso->FaninSig += pIsoF->Id * s_1kPrimes[Abc_Var2Lit(pIsoF->Id, Aig_ObjFaninC0(pObjLi)) & ISO_MASK];

            pIsoF->FanoutSig += pIso->FanoutSig;
            if ( pIso->Id )
                pIsoF->FanoutSig += pIso->Id * s_1kPrimes[Abc_Var2Lit(pIso->Id, Aig_ObjFaninC0(pObjLi)) & ISO_MASK];
        }
    }
}